

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O2

bool __thiscall
lzham::vector<lzham::node>::try_resize_no_construct
          (vector<lzham::node> *this,uint new_size,bool grow_hint)

{
  bool bVar1;
  
  if ((this->m_capacity < new_size) &&
     (bVar1 = increase_capacity(this,new_size,this->m_size + 1 == new_size || grow_hint,true),
     !bVar1)) {
    return false;
  }
  this->m_size = new_size;
  return true;
}

Assistant:

inline bool try_resize_no_construct(uint new_size, bool grow_hint = false)
      {
         if (new_size > m_capacity)
         {
            if (!increase_capacity(new_size, (new_size == (m_size + 1)) || grow_hint, true))
               return false;
         }
         
         m_size = new_size;

         return true;
      }